

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20HM303D.cpp
# Opt level: O1

bool __thiscall RTIMUGD20HM303D::setAccelCTRL1(RTIMUGD20HM303D *this)

{
  uint uVar1;
  RTIMUSettings *this_00;
  bool bVar2;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar1 = this_00->m_GD20HM303DAccelSampleRate;
  if (uVar1 < 0xb) {
    bVar2 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_accelCompassSlaveAddr,' ',
                               (char)uVar1 << 4 | 7,"Failed to set LSM303D CTRL1");
    return bVar2;
  }
  fprintf(_stderr,"Illegal LSM303D accel sample rate code %d\n");
  return false;
}

Assistant:

bool RTIMUGD20HM303D::setAccelCTRL1()
{
    unsigned char ctrl1;

    if ((m_settings->m_GD20HM303DAccelSampleRate < 0) || (m_settings->m_GD20HM303DAccelSampleRate > 10)) {
        HAL_ERROR1("Illegal LSM303D accel sample rate code %d\n", m_settings->m_GD20HM303DAccelSampleRate);
        return false;
    }

    ctrl1 = (m_settings->m_GD20HM303DAccelSampleRate << 4) | 0x07;

    return m_settings->HALWrite(m_accelCompassSlaveAddr,  LSM303D_CTRL1, ctrl1, "Failed to set LSM303D CTRL1");
}